

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O1

bool __thiscall
USBSignalFilter::GetPacket(USBSignalFilter *this,USBPacket *pckt,USBSignalState *sgnl)

{
  pointer *ppuVar1;
  double dVar2;
  double dVar3;
  USB_PID UVar4;
  pointer puVar5;
  pointer puVar6;
  iterator iVar7;
  iterator __position;
  pointer puVar8;
  double dVar9;
  USBPacket *pUVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ushort uVar15;
  ulong uVar16;
  Channel *pCVar17;
  bool bVar18;
  uint uVar19;
  char *pcVar20;
  uint uVar21;
  char *pcVar22;
  bool bVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  U8 bits2add [7];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  U8 val;
  undefined4 uStack_a0;
  undefined3 uStack_9c;
  char *local_98;
  char *pcStack_90;
  undefined8 local_88;
  vector<unsigned_long_long,std::allocator<unsigned_long_long>> *local_80;
  USBPacket *local_78;
  USBSignalState local_70;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_50;
  double local_48;
  undefined8 uStack_40;
  
  puVar5 = (pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  puVar6 = (pckt->mBitBeginSamples).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pckt->mBitBeginSamples).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar6) {
    (pckt->mBitBeginSamples).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
  }
  pckt->mPID = PID_Unknown;
  pckt->mCRC = 0;
  pckt->mSampleBegin = 0;
  pckt->mSampleEnd = 0;
  uStack_9c = 0x10101;
  uStack_a0 = 0x1010100;
  if (this->mExpectLowSpeed == true) {
    dVar2 = sgnl->mDur;
    if ((((dVar2 <= 24.999999999999996) || (625.0 <= dVar2)) || (S_J < sgnl->mState)) ||
       ((int)(dVar2 / 83.33333333333333 + 0.5) != 1)) {
      this->mSpeed = LOW_SPEED;
    }
    else {
      this->mSpeed = FULL_SPEED;
      this->mExpectLowSpeed = false;
    }
  }
  local_50 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&pckt->mData;
  local_80 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
             &pckt->mBitBeginSamples;
  dVar2 = *(double *)(&DAT_001551c0 + (ulong)(this->mSpeed == FULL_SPEED) * 8);
  uVar12 = Analyzer::GetSampleRate();
  dVar2 = dVar2 / (1000000000.0 / (double)uVar12);
  local_98 = (char *)0x0;
  pcStack_90 = (char *)0x0;
  local_88 = 0;
  pckt->mSampleBegin = sgnl->mSampleBegin;
  bVar18 = false;
  uVar12 = 0;
  local_78 = pckt;
  do {
    pUVar10 = local_78;
    if (this->mSpeed == LOW_SPEED) {
      dVar3 = sgnl->mDur;
      uVar24 = SUB84(dVar3,0);
      uVar25 = (undefined4)((ulong)dVar3 >> 0x20);
      bVar23 = true;
      if (466.66666666666663 < dVar3) {
        uVar26 = 0xaaaaaaaa;
        uVar27 = 0x40b302aa;
        goto LAB_00138d99;
      }
    }
    else {
      dVar3 = sgnl->mDur;
      uVar24 = SUB84(dVar3,0);
      uVar25 = (undefined4)((ulong)dVar3 >> 0x20);
      bVar23 = true;
      if (24.999999999999996 < dVar3) {
        uVar26 = 0;
        uVar27 = 0x40838800;
LAB_00138d99:
        bVar23 = true;
        if ((double)CONCAT44(uVar25,uVar24) <= (double)CONCAT44(uVar27,uVar26) &&
            (double)CONCAT44(uVar27,uVar26) != (double)CONCAT44(uVar25,uVar24)) {
          bVar23 = S_J < sgnl->mState;
        }
      }
    }
    if ((bVar23) || (bVar18)) break;
    uVar21 = (uint)(sgnl->mDur /
                    *(double *)(&DAT_001551c0 + (ulong)(this->mSpeed == FULL_SPEED) * 8) + 0.5);
    if (0 < (int)uVar21) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,pcStack_90,
                 (long)&uStack_a0 + (ulong)uVar12,(long)&uStack_a0 + (ulong)uVar21);
      uVar19 = 0;
      do {
        dVar3 = (double)(int)uVar19;
        if (((byte)uVar12 & uVar19 == 0) == 0) {
          uStack_40 = 0;
          dVar9 = dVar2 * dVar3 + 0.5;
          uVar16 = (ulong)dVar9;
          local_70.mSampleBegin =
               ((long)(dVar9 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) +
               sgnl->mSampleBegin;
          iVar7._M_current =
               (local_78->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_48 = dVar3;
          if (iVar7._M_current ==
              (local_78->mBitBeginSamples).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
            _M_realloc_insert<unsigned_long_long>
                      ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_80,
                       iVar7,&local_70.mSampleBegin);
            dVar3 = local_48;
          }
          else {
            *iVar7._M_current = local_70.mSampleBegin;
            (local_78->mBitBeginSamples).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          }
        }
        dVar3 = (dVar3 + 0.5) * dVar2 + 0.5;
        lVar14 = (long)dVar3;
        pCVar17 = (Channel *)0xa;
        if (uVar19 == 0) {
          pCVar17 = (Channel *)(ulong)(((byte)~(byte)uVar12 & 1) * 4 + 7);
        }
        AnalyzerResults::AddMarker
                  ((ulonglong)this->mResults,
                   ((uint)(long)(dVar3 - 9.223372036854776e+18) & (uint)(lVar14 >> 0x3f) |
                   (uint)lVar14) + (int)sgnl->mSampleBegin,pCVar17);
        uVar19 = uVar19 + 1;
      } while (uVar21 != uVar19);
    }
    if (((this->mSpeed == FULL_SPEED) && ((long)pcStack_90 - (long)local_98 == 0x10)) &&
       ((pcStack_90 == local_98 || (iVar13 = bcmp(local_98,&DAT_001551d0,0x10), iVar13 == 0)))) {
      this->mSpeed = LOW_SPEED;
      this->mExpectLowSpeed = true;
      bVar18 = true;
    }
    GetState(&local_70,this);
    uVar12 = (uint)(uVar21 == 7);
    sgnl->mState = local_70.mState;
    *(undefined4 *)&sgnl->field_0x14 = local_70._20_4_;
    *(undefined4 *)&sgnl->mDur = local_70.mDur._0_4_;
    *(undefined4 *)((long)&sgnl->mDur + 4) = local_70.mDur._4_4_;
    sgnl->mSampleBegin = local_70.mSampleBegin;
    sgnl->mSampleEnd = local_70.mSampleEnd;
  } while( true );
  local_78->mSampleEnd = sgnl->mSampleEnd;
  iVar7._M_current =
       (local_78->mBitBeginSamples).
       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (local_78->mBitBeginSamples).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
    _M_realloc_insert<unsigned_long_long_const&>(local_80,iVar7,&sgnl->mSampleBegin);
  }
  else {
    *iVar7._M_current = sgnl->mSampleBegin;
    (local_78->mBitBeginSamples).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar7._M_current + 1;
  }
  if (((local_98 == pcStack_90) || (((int)pcStack_90 - (int)local_98 & 7U) != 0)) ||
     (puVar6 = (pUVar10->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start,
     (*(int *)&(pUVar10->mBitBeginSamples).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish - (int)puVar6 & 0x38U) != 8)) {
    bVar18 = false;
    goto LAB_001390b4;
  }
  pUVar10->mSampleBegin = *puVar6;
  pUVar10->mSampleEnd = (long)(dVar2 + 0.5) + sgnl->mSampleEnd;
  local_70.mSampleBegin = local_70.mSampleBegin & 0xffffffffffffff00;
  if (local_98 != pcStack_90) {
    pcVar20 = local_98;
    pcVar22 = local_98;
    do {
      pcVar22 = pcVar22 + 1;
      bVar11 = (byte)local_70.mSampleBegin >> 1;
      if (*pcVar20 != '\0') {
        bVar11 = bVar11 | 0x80;
      }
      local_70.mSampleBegin = CONCAT71(local_70.mSampleBegin._1_7_,bVar11);
      if (((int)pcVar22 - (int)local_98 & 7U) == 0) {
        __position._M_current =
             (pUVar10->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pUVar10->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>(local_50,__position,(uchar *)&local_70);
        }
        else {
          *__position._M_current = bVar11;
          ppuVar1 = &(pUVar10->mData).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
      }
      pcVar20 = pcVar20 + 1;
    } while (pcVar20 != pcStack_90);
  }
  puVar5 = (pUVar10->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar8 = (pUVar10->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar16 = (long)puVar8 - (long)puVar5;
  if (1 < uVar16) {
    pUVar10->mPID = (uint)puVar5[1];
  }
  if (3 < uVar16) {
    if (uVar16 == 4) {
      uVar15 = (ushort)(puVar8[-1] >> 3);
    }
    else {
      uVar15 = CONCAT11(puVar8[-1],puVar8[-2]);
    }
    pUVar10->mCRC = uVar15;
  }
  UVar4 = pUVar10->mPID;
  if ((int)UVar4 < 0x69) {
    if ((int)UVar4 < 0x4b) {
      if (UVar4 == PID_STALL) goto LAB_0013916a;
      if (UVar4 == PID_SETUP) goto LAB_0013912a;
    }
    else {
      if (UVar4 == PID_DATA1) goto LAB_0013914c;
LAB_00139165:
      if (UVar4 == PID_NAK) goto LAB_0013916a;
    }
  }
  else {
    if ((int)UVar4 < 0xd2) {
      if (UVar4 == PID_IN) goto LAB_0013912a;
LAB_00139144:
      if (UVar4 != PID_DATA0) goto LAB_00139176;
LAB_0013914c:
      bVar18 = true;
      if (3 < uVar16) goto LAB_001390b4;
      if ((UVar4 != PID_STALL) && (UVar4 != PID_ACK)) goto LAB_00139165;
    }
    else {
      if (UVar4 == PID_ACK) goto LAB_0013916a;
      if (UVar4 != PID_OUT) goto LAB_00139176;
LAB_0013912a:
      bVar18 = true;
      if (uVar16 == 4) goto LAB_001390b4;
      if ((int)UVar4 < 0x5a) {
        if (UVar4 != PID_STALL) {
          if (UVar4 == PID_DATA1) goto LAB_0013914c;
          goto LAB_00139176;
        }
      }
      else if ((UVar4 != PID_NAK) && (UVar4 != PID_ACK)) goto LAB_00139144;
    }
LAB_0013916a:
    bVar18 = true;
    if (uVar16 == 2) goto LAB_001390b4;
  }
LAB_00139176:
  bVar18 = true;
  if (uVar16 != 2 || UVar4 != PID_PRE) {
    bVar18 = uVar16 == 4 && UVar4 == PID_SOF;
  }
LAB_001390b4:
  if (local_98 != (char *)0x0) {
    operator_delete(local_98);
  }
  return bVar18;
}

Assistant:

bool USBSignalFilter::GetPacket( USBPacket& pckt, USBSignalState& sgnl )
{
    pckt.Clear();

    const U8 bits2add[] = { 0, 1, 1, 1, 1, 1, 1 };

    // a PRE packet switched us into low speed mode, so now we need to check
    // if this packet is low or full speed
    if( mExpectLowSpeed )
    {
        if( sgnl.IsData( FULL_SPEED ) && sgnl.GetNumBits( FULL_SPEED ) == 1 )
        {
            mSpeed = FULL_SPEED;
            mExpectLowSpeed = false; // switch back to full speed
        }
        else
        {
            mSpeed = LOW_SPEED;
        }
    }

    const double BIT_DUR = ( mSpeed == FULL_SPEED ? FS_BIT_DUR : LS_BIT_DUR );
    const double SAMPLE_DUR = 1e9 / mAnalyzer->GetSampleRate(); // 1 sample duration in ns
    const double BIT_SAMPLES = BIT_DUR / SAMPLE_DUR;

    std::vector<U8> bits;

    pckt.mSampleBegin = sgnl.mSampleBegin; // default for bad packets

    bool is_stuff_bit = false;
    bool is_pre_packet = false;
    while( sgnl.IsData( mSpeed ) && !is_pre_packet )
    {
        // get the number of bits in this signal
        int num_bits = sgnl.GetNumBits( mSpeed );

        const U8* add_begin = bits2add;
        const U8* add_end = bits2add + num_bits;

        // mind the stuffing bit
        if( is_stuff_bit )
            ++add_begin;

        // now add the data bits
        if( ( is_stuff_bit && num_bits > 1 ) || ( num_bits > 0 ) )
            bits.insert( bits.end(), add_begin, add_end );

        // do the bit markers and remember the samples at which a bit begins
        int bc;
        for( bc = 0; bc < num_bits; ++bc )
        {
            if( !is_stuff_bit || bc > 0 )
                pckt.mBitBeginSamples.push_back( sgnl.mSampleBegin + U64( BIT_SAMPLES * bc + .5 ) );

            mResults->AddMarker( sgnl.mSampleBegin + U64( BIT_SAMPLES * ( bc + .5 ) + .5 ),
                                 bc == 0 ? ( is_stuff_bit ? AnalyzerResults::ErrorX : AnalyzerResults::Zero ) : AnalyzerResults::One,
                                 mSettings->mDPChannel );
        }

        // check if this is a PRE token, in which case we switch to low-speed,
        // return and wait for the next packet
        if( mSpeed == FULL_SPEED && bits.size() == 16 ) // 8 bits for SYNC and 8 bits for PRE PID
        {
            const U8 preArr[ 16 ] = { 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 1, 1, 1, 1, 0, 0 }; // SYNC and PRE as they appear on the bus
            if( std::equal( bits.begin(), bits.end(), preArr ) )
            {
                mSpeed = LOW_SPEED;
                mExpectLowSpeed = true;
                is_pre_packet = true;
            }
        }

        // set the stuff bit flag for the next state
        is_stuff_bit = ( num_bits == 7 );

        // get the next signal state
        sgnl = GetState();
    }

    pckt.mSampleEnd = sgnl.mSampleEnd; // default for bad packets

    // add another element to mBitBeginSamples to mark the end of the last bit
    pckt.mBitBeginSamples.push_back( sgnl.mSampleBegin );

    // check the number of bits
    if( bits.empty() || ( bits.size() % 8 ) != 0 || ( pckt.mBitBeginSamples.size() % 8 ) != 1 )
    {
        return false;
    }

    // remember the begin & end samples for the entire packet
    pckt.mSampleBegin = pckt.mBitBeginSamples.front();
    pckt.mSampleEnd = sgnl.mSampleEnd + S64( BIT_DUR / SAMPLE_DUR + 0.5 );

    // make bytes out of these bits
    U8 val = 0;
    std::vector<U8>::iterator i( bits.begin() );
    while( i != bits.end() )
    {
        // least significant bit first
        val >>= 1;
        if( *i )
            val |= 0x80;

        ++i;

        // do we have a full byte?
        if( ( ( i - bits.begin() ) % 8 ) == 0 )
            pckt.mData.push_back( val );
    }

    // extract the PID
    if( pckt.mData.size() > 1 )
        pckt.mPID = USB_PID( pckt.mData[ 1 ] );

    // extract the CRC fields
    if( pckt.mData.size() >= 4 )
    {
        U16 last_word = ( pckt.mData.back() << 8 ) | *( pckt.mData.end() - 2 );

        if( pckt.mData.size() == 4 )
            pckt.mCRC = last_word >> 11;
        else
            pckt.mCRC = last_word;
    }

    return ( pckt.IsTokenPacket() && pckt.mData.size() == 4 ) || ( pckt.IsDataPacket() && pckt.mData.size() >= 4 ) ||
           ( pckt.IsHandshakePacket() && pckt.mData.size() == 2 ) || ( pckt.mPID == PID_PRE && pckt.mData.size() == 2 ) ||
           ( pckt.IsSOFPacket() && pckt.mData.size() == 4 );
}